

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Parent * __thiscall
kj::_::BTreeImpl::insertHelper<kj::_::BTreeImpl::Parent>
          (BTreeImpl *this,SearchKey *searchKey,Parent *node,Parent *parent,uint indexInParent,
          uint pos)

{
  NodeUnion *pNVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  char cVar10;
  Parent *pPVar11;
  Parent *pPVar12;
  uint uVar13;
  AllocResult<kj::_::BTreeImpl::Parent> AVar14;
  AllocResult<kj::_::BTreeImpl::Parent> AVar15;
  
  if (node->keys[6].i != 0) {
    AVar14 = alloc<kj::_::BTreeImpl::Parent>(this);
    pPVar11 = AVar14.node;
    if (parent == (Parent *)0x0) {
      AVar15 = alloc<kj::_::BTreeImpl::Parent>(this);
      pPVar12 = AVar15.node;
      uVar13 = node->keys[3].i;
      pPVar12->keys[2].i = node->keys[6].i;
      *(undefined8 *)pPVar12->keys = *(undefined8 *)(node->keys + 4);
      node->keys[3] = 0;
      node->keys[4] = 0;
      node->keys[5] = 0;
      node->keys[6] = 0;
      uVar9 = *(undefined8 *)(node->children + 6);
      *(undefined8 *)pPVar12->children = *(undefined8 *)(node->children + 4);
      *(undefined8 *)(pPVar12->children + 2) = uVar9;
      node->children[4] = 0;
      node->children[5] = 0;
      node->children[6] = 0;
      node->children[7] = 0;
      pPVar11->children[4] = 0;
      pPVar11->children[5] = 0;
      pPVar11->children[6] = 0;
      pPVar11->children[7] = 0;
      uVar2 = node->unused;
      uVar3 = node->keys[0].i;
      uVar4 = node->keys[1].i;
      uVar5 = node->keys[2].i;
      uVar9 = *(undefined8 *)(node->children + 2);
      *(undefined8 *)pPVar11->children = *(undefined8 *)node->children;
      *(undefined8 *)(pPVar11->children + 2) = uVar9;
      uVar6 = node->keys[4].i;
      uVar7 = node->keys[5].i;
      uVar8 = node->keys[6].i;
      pPVar11->keys[3].i = node->keys[3].i;
      pPVar11->keys[4].i = uVar6;
      pPVar11->keys[5].i = uVar7;
      pPVar11->keys[6].i = uVar8;
      pPVar11->unused = uVar2;
      pPVar11->keys[0].i = uVar3;
      pPVar11->keys[1].i = uVar4;
      pPVar11->keys[2].i = uVar5;
      pNVar1 = this->tree;
      (pNVar1->field_0).freelist.zero[0] = uVar13;
      (pNVar1->field_0).freelist.zero[7] = AVar14.index;
      (pNVar1->field_0).freelist.zero[8] = AVar15.index;
      *(undefined8 *)((long)&pNVar1->field_0 + 8) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x10) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x18) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x28) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x30) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x38) = 0;
      this->height = this->height + 1;
      cVar10 = (**(code **)(*(long *)searchKey + 0x10))(searchKey,uVar13 - 1);
      node = pPVar11;
      if (cVar10 != '\0') {
        node = pPVar12;
      }
    }
    else {
      uVar13 = node->keys[3].i - 1;
      pPVar11->keys[2].i = node->keys[6].i;
      *(undefined8 *)pPVar11->keys = *(undefined8 *)(node->keys + 4);
      node->keys[3] = 0;
      node->keys[4] = 0;
      node->keys[5] = 0;
      node->keys[6] = 0;
      uVar9 = *(undefined8 *)(node->children + 6);
      *(undefined8 *)pPVar11->children = *(undefined8 *)(node->children + 4);
      *(undefined8 *)(pPVar11->children + 2) = uVar9;
      node->children[4] = 0;
      node->children[5] = 0;
      node->children[6] = 0;
      node->children[7] = 0;
      Parent::insertAfter(parent,indexInParent,uVar13,AVar14.index);
      cVar10 = (**(code **)(*(long *)searchKey + 0x10))(searchKey,uVar13);
      if (cVar10 != '\0') {
        node = pPVar11;
      }
    }
  }
  return node;
}

Assistant:

Node& BTreeImpl::insertHelper(const SearchKey& searchKey,
    Node& node, Parent* parent, uint indexInParent, uint pos) {
  if (node.isFull()) {
    // This node is full. Need to split.
    if (parent == nullptr) {
      // This is the root node. We need to split into two nodes and create a new root.
      auto n1 = alloc<Node>();
      auto n2 = alloc<Node>();

      uint pivot = split(n2.node, n2.index, node, pos);
      move(n1.node, n1.index, node);

      // Rewrite root to have the two children.
      tree[0].parent.initRoot(pivot, n1.index, n2.index);

      // Increased height.
      ++height;

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the right one
        return n2.node;
      } else {
        // the left one
        return n1.node;
      }
    } else {
      // This is a non-root parent node. We need to split it into two and insert the new node
      // into the grandparent.
      auto n = alloc<Node>();
      uint pivot = split(n.node, n.index, node, pos);

      // Insert new child into grandparent.
      parent->insertAfter(indexInParent, pivot, n.index);

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the new one, which is right of the original
        return n.node;
      } else {
        // the original one, which is left of the new one
        return node;
      }
    }
  } else {
    // No split needed.
    return node;
  }
}